

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall libserver::server::_handle_ping_req(server *this)

{
  ostream *poVar1;
  ptime pVar2;
  ptime t;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  posix_time *local_38;
  string local_30;
  server *local_10;
  server *this_local;
  
  local_10 = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"Received ping from ");
  poVar1 = std::operator<<(poVar1,(string *)&this->client_name);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Last ping: ");
  local_38 = (posix_time *)
             (this->_ping).
             super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
             .time_.time_count_.value_;
  boost::posix_time::to_simple_string_abi_cxx11_(&local_30,local_38,t);
  poVar1 = std::operator<<(poVar1,(string *)&local_30);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_30);
  if ((this->_map_change & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"pok",&local_89);
    std::operator+(&local_68,&local_88,"\n");
    _write_to_socket(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  else {
    _handle_list_request(this);
  }
  pVar2 = boost::date_time::microsec_clock<boost::posix_time::ptime>::local_time();
  (this->_ping).
  super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  .time_.time_count_.value_ =
       (int_type)
       pVar2.
       super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
       .time_.time_count_.value_;
  this->_map_change = false;
  return;
}

Assistant:

void libserver::server::_handle_ping_req()
{
    // Respond to ping request
    std::cout<<"Received ping from "<<client_name<<std::endl;
    std::cout<<"Last ping: "<<boost::posix_time::to_simple_string(_ping)<<std::endl;
    if(_map_change)
    {
        _handle_list_request();
    }
    else
    {
        _write_to_socket(_PING_RESPONSE_+"\n");
    }
    _ping = boost::posix_time::microsec_clock::local_time();
    _map_change = false;
}